

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O3

void __thiscall
hungarian_algorithm::
BruteForceSolver<int,_boost::numeric::ublas::matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>,_std::less<int>,_unsigned_long>
::BruteForceSolver(BruteForceSolver<int,_boost::numeric::ublas::matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>,_std::less<int>,_unsigned_long>
                   *this,matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
                         *cost_function,unsigned_long num_rows,unsigned_long num_cols,
                  less<int> *cost_comparator,int *zero_cost)

{
  allocator_type local_2c;
  bool local_2b;
  allocator_type local_2a;
  allocator_type local_29;
  
  this->cost_function_ = cost_function;
  this->cost_comparator_ = cost_comparator;
  this->zero_cost_ = *zero_cost;
  this->num_rows_ = num_rows;
  this->num_cols_ = num_cols;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->current_assignment_,num_rows,&this->num_cols_,&local_29);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->optimal_assignment_,this->num_rows_,&this->num_cols_,&local_2a);
  local_2b = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&this->covered_cols_,this->num_cols_,&local_2b,&local_2c);
  (this->optimal_cost_).first = this->num_rows_;
  (this->optimal_cost_).second = *zero_cost;
  return;
}

Assistant:

BruteForceSolver(const CostFunction& cost_function, const Size num_rows, const Size num_cols,
                   const CostComparator& cost_comparator, const Cost& zero_cost)
    : cost_function_(cost_function), cost_comparator_(cost_comparator), zero_cost_(zero_cost),
      num_rows_(static_cast<std::size_t>(num_rows)), num_cols_(static_cast<std::size_t>(num_cols)),
      current_assignment_(num_rows_, num_cols_), optimal_assignment_(num_rows_, num_cols_),
      covered_cols_(num_cols_, false), optimal_cost_(num_rows_, zero_cost)
  {
  }